

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarmath_p.h
# Opt level: O3

R_conflict20 QRomanCalendrical::dayInYearToYmd(int dayInYear)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  R_conflict20 RVar4;
  
  if (dayInYear < 0) {
    uVar2 = dayInYear * -5 - 3;
    uVar1 = ((uVar2 / 0x99) * 0x99 - uVar2) + 0x98;
    if (0x131 < uVar2) {
      uVar2 = uVar2 / 0x99 - 2;
      uVar3 = ~(uVar2 / 0xc);
      uVar2 = ((uVar2 / 0xc) * 0xc - uVar2) + 0xb;
      goto LAB_0034e2de;
    }
    uVar2 = ~(uVar2 / 0x99);
  }
  else {
    uVar1 = dayInYear * 5 + 2;
    uVar2 = uVar1 / 0x99;
    uVar1 = uVar1 % 0x99;
  }
  uVar3 = (uVar2 + 2) / 0xc;
  uVar2 = (uVar2 + 2) % 0xc;
LAB_0034e2de:
  RVar4._0_8_ = CONCAT44(uVar2,uVar3) + 0x100000000;
  RVar4.day._0_1_ = (char)((uVar1 & 0xff) / 5) + '\x01';
  RVar4.day._1_3_ = 0;
  return RVar4;
}

Assistant:

constexpr auto dayInYearToYmd(int dayInYear)
{
    // The year is an adjustment to the year for which dayInYear may be denormal.
    struct R { int year; int month; int day; };
    // Shared code for Julian and Milankovic (at least).
    using namespace QRoundingDown;
    const auto month5Day = qDivMod<FiveMonths>(5 * dayInYear + 2);
    // Its remainder changes by 5 per day, except at roughly monthly quotient steps.
    const auto yearMonth = qDivMod<12>(month5Day.quotient + 2);
    return R { yearMonth.quotient, yearMonth.remainder + 1, qDiv<5>(month5Day.remainder) + 1 };
}